

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

void __thiscall booster::locale::calendar::~calendar(calendar *this)

{
  locale *in_RDI;
  
  hold_ptr<booster::locale::abstract_calendar>::~hold_ptr
            ((hold_ptr<booster::locale::abstract_calendar> *)in_RDI);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  std::locale::~locale(in_RDI);
  return;
}

Assistant:

calendar::~calendar()
{
}